

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTcGenTarg::note_list(CTcGenTarg *this,size_t element_count)

{
  if (this->max_list_cnt_ < element_count) {
    if (this->max_list_cnt_ < 0x199a && 0x1999 < element_count) {
      CTcTokenizer::log_warning(0x3a99);
    }
    this->max_list_cnt_ = element_count;
  }
  return;
}

Assistant:

void CTcGenTarg::note_list(size_t element_count)
{
    /* if it's the longest list so far, remember it */
    if (element_count > max_list_cnt_)
    {
        /* flag a warning if the stored length would be over 32k */
        if (element_count > ((32*1024 - VMB_LEN) / VMB_DATAHOLDER)
            && max_list_cnt_ <= ((32*1024 - VMB_LEN) / VMB_DATAHOLDER))
            G_tok->log_warning(TCERR_CONST_POOL_OVER_32K);

        /* remember the length */
        max_list_cnt_ = element_count;
    }
}